

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_sasl_init(SASL_INIT_HANDLE sasl_init)

{
  AMQP_VALUE pAVar1;
  
  if (sasl_init != (SASL_INIT_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(sasl_init->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_sasl_init(SASL_INIT_HANDLE sasl_init)
{
    AMQP_VALUE result;

    if (sasl_init == NULL)
    {
        result = NULL;
    }
    else
    {
        SASL_INIT_INSTANCE* sasl_init_instance = (SASL_INIT_INSTANCE*)sasl_init;
        result = amqpvalue_clone(sasl_init_instance->composite_value);
    }

    return result;
}